

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonObjectFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  uint uVar2;
  sqlite3_value *psVar3;
  Mem *pMVar4;
  u32 N;
  char *zIn;
  long lVar5;
  long in_FS_OFFSET;
  undefined1 local_c0 [48];
  undefined1 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((argc & 1U) != 0) {
    ctx->isError = 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3VdbeMemSetStr
                (ctx->pOut,"json_object() requires an even number of arguments",-1,'\x01',
                 (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    goto LAB_001b8057;
  }
  local_c0._8_8_ = local_c0 + 0x22;
  local_c0._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_50 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
  local_80 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_90 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
  local_c0._16_8_ = 100;
  local_c0._24_8_ = 1;
  local_c0[0x20] = '\x01';
  local_c0[0x21] = '\0';
  local_c0[0x22] = '{';
  local_c0[0x23] = -0x56;
  local_c0[0x24] = -0x56;
  local_c0[0x25] = -0x56;
  local_c0[0x26] = -0x56;
  local_c0[0x27] = -0x56;
  local_c0._0_8_ = ctx;
  if (argc < 1) {
    local_c0._24_8_ = 1;
LAB_001b7fb1:
    *(char *)(local_c0._8_8_ + local_c0._24_8_) = '}';
    local_c0._24_8_ = local_c0._24_8_ + 1;
  }
  else {
    lVar5 = 0;
    do {
      psVar3 = argv[lVar5];
      uVar2._0_2_ = psVar3->flags;
      uVar2._2_1_ = psVar3->enc;
      uVar2._3_1_ = psVar3->eSubtype;
      if ((0x4000000040004U >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        ctx->isError = 1;
        sqlite3VdbeMemSetStr
                  (ctx->pOut,"json_object() labels must be TEXT",-1,'\x01',
                   (_func_void_void_ptr *)0xffffffffffffffff);
        if (local_c0[0x20] == '\0') {
          if (*(ulong *)(local_c0._8_8_ + -8) < 2) {
            sqlite3_free((long *)(local_c0._8_8_ + -8));
          }
          else {
            *(long *)(local_c0._8_8_ + -8) = *(ulong *)(local_c0._8_8_ + -8) - 1;
          }
        }
        goto LAB_001b8032;
      }
      jsonAppendSeparator((JsonString *)local_c0);
      zIn = (char *)sqlite3ValueText(argv[lVar5],'\x01');
      N = sqlite3ValueBytes(argv[lVar5],'\x01');
      jsonAppendString((JsonString *)local_c0,zIn,N);
      if ((ulong)local_c0._24_8_ < (ulong)local_c0._16_8_) {
        *(char *)(local_c0._8_8_ + local_c0._24_8_) = ':';
        local_c0._24_8_ = local_c0._24_8_ + 1;
      }
      else {
        jsonAppendCharExpand((JsonString *)local_c0,':');
      }
      jsonAppendSqlValue((JsonString *)local_c0,argv[lVar5 + 1]);
      lVar5 = lVar5 + 2;
    } while ((int)lVar5 < argc);
    if ((ulong)local_c0._24_8_ < (ulong)local_c0._16_8_) goto LAB_001b7fb1;
    jsonAppendCharExpand((JsonString *)local_c0,'}');
  }
  jsonReturnString((JsonString *)local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
  pMVar4 = ctx->pOut;
  pMVar4->eSubtype = 'J';
  pbVar1 = (byte *)((long)&pMVar4->flags + 1);
  *pbVar1 = *pbVar1 | 8;
LAB_001b8032:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001b8057:
  __stack_chk_fail();
}

Assistant:

static void jsonObjectFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  int i;
  JsonString jx;
  const char *z;
  u32 n;

  if( argc&1 ){
    sqlite3_result_error(ctx, "json_object() requires an even number "
                                  "of arguments", -1);
    return;
  }
  jsonStringInit(&jx, ctx);
  jsonAppendChar(&jx, '{');
  for(i=0; i<argc; i+=2){
    if( sqlite3_value_type(argv[i])!=SQLITE_TEXT ){
      sqlite3_result_error(ctx, "json_object() labels must be TEXT", -1);
      jsonStringReset(&jx);
      return;
    }
    jsonAppendSeparator(&jx);
    z = (const char*)sqlite3_value_text(argv[i]);
    n = sqlite3_value_bytes(argv[i]);
    jsonAppendString(&jx, z, n);
    jsonAppendChar(&jx, ':');
    jsonAppendSqlValue(&jx, argv[i+1]);
  }
  jsonAppendChar(&jx, '}');
  jsonReturnString(&jx, 0, 0);
  sqlite3_result_subtype(ctx, JSON_SUBTYPE);
}